

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int FE_Insert_Line(FORM *form)

{
  FIELD *field_00;
  _Bool _Var1;
  _Bool local_1e;
  int local_1c;
  _Bool Maybe_Done;
  int result;
  FIELD *field;
  FORM *form_local;
  
  field_00 = form->current;
  local_1c = -0xc;
  _Var1 = Check_Char(field_00->type,0x20,(TypeArgument *)field_00->arg);
  if (_Var1) {
    local_1e = false;
    if (form->currow != field_00->drows + -1) {
      local_1e = Is_There_Room_For_A_Line(form);
    }
    if (((int)field_00->rows + field_00->nrow != 1) &&
       ((local_1e != false || ((field_00->status & 8) != 0)))) {
      if ((local_1e != false) || (_Var1 = Field_Grown(field_00,1), _Var1)) {
        form->curcol = 0;
        winsdelln(form->w,1);
        local_1c = 0;
      }
      else {
        local_1c = -1;
      }
    }
  }
  return local_1c;
}

Assistant:

static int FE_Insert_Line(FORM * form)
{
  FIELD *field = form->current;
  int result = E_REQUEST_DENIED;

  if (Check_Char(field->type,(int)C_BLANK,(TypeArgument *)(field->arg)))
    {
      bool Maybe_Done = (form->currow!=(field->drows-1)) && 
                        Is_There_Room_For_A_Line(form);

      if (!Single_Line_Field(field) &&
          (Maybe_Done || Growable(field)))
        {
          if (!Maybe_Done && !Field_Grown(field,1))
            result = E_SYSTEM_ERROR;
          else
            {
              form->curcol = 0;
              winsertln(form->w);
              result = E_OK;
            }
        }
    }
  return result;
}